

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O0

bool google::protobuf::internal::anon_unknown_36::HasLazyRep
               (FieldDescriptor *field,FieldOptions *options)

{
  bool bVar1;
  Type TVar2;
  bool local_19;
  FieldOptions *options_local;
  FieldDescriptor *field_local;
  
  TVar2 = FieldDescriptor::type(field);
  local_19 = false;
  if (TVar2 == TYPE_MESSAGE) {
    bVar1 = FieldDescriptor::is_repeated(field);
    local_19 = false;
    if (!bVar1) {
      local_19 = options->lazy_opt != 0;
    }
  }
  return local_19;
}

Assistant:

bool HasLazyRep(const FieldDescriptor* field,
                const TailCallTableInfo::FieldOptions& options) {
  return field->type() == field->TYPE_MESSAGE && !field->is_repeated() &&
         options.lazy_opt != 0;
}